

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darData.c
# Opt level: O3

Vec_Int_t * Dar_LibReadOuts(void)

{
  Vec_Int_t *p;
  int *piVar1;
  long lVar2;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 0x60c4;
  p->nSize = 0;
  piVar1 = (int *)malloc(0x18310);
  p->pArray = piVar1;
  lVar2 = 0;
  do {
    Vec_IntPush(p,*(int *)((long)s_Data2 + lVar2));
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x18310);
  return p;
}

Assistant:

Vec_Int_t * Dar_LibReadOuts()
{
    Vec_Int_t * vResult;
    int i;
    vResult = Vec_IntAlloc( s_nDataSize2 );
    for ( i = 0; i < s_nDataSize2; i++ )
        Vec_IntPush( vResult, s_Data2[i] );
    return vResult;
}